

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O0

pjpeg_t * pjpeg_create_from_file(char *path,uint32_t flags,int *error)

{
  FILE *__stream;
  size_t __size;
  uint8_t *buf_00;
  size_t sVar1;
  pjpeg_t *pj;
  int res;
  uint8_t *buf;
  long buflen;
  FILE *f;
  int *error_local;
  uint32_t flags_local;
  char *path_local;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    path_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    buf_00 = (uint8_t *)malloc(__size);
    fseek(__stream,0,0);
    sVar1 = fread(buf_00,1,__size,__stream);
    fclose(__stream);
    if ((long)(int)sVar1 == __size) {
      path_local = (char *)pjpeg_create_from_buffer(buf_00,(int)__size,flags,error);
      free(buf_00);
    }
    else {
      free(buf_00);
      if (error != (int *)0x0) {
        *error = 1;
      }
      path_local = (char *)0x0;
    }
  }
  return (pjpeg_t *)path_local;
}

Assistant:

pjpeg_t *pjpeg_create_from_file(const char *path, uint32_t flags, int *error)
{
    FILE *f = fopen(path, "r");
    if (f == NULL)
        return NULL;

    fseek(f, 0, SEEK_END);
    long buflen = ftell(f);

    uint8_t *buf = malloc(buflen);
    fseek(f, 0, SEEK_SET);
    int res = fread(buf, 1, buflen, f);
    fclose(f);
    if (res != buflen) {
        free(buf);
        if (error)
            *error = PJPEG_ERR_FILE;
        return NULL;
    }

    pjpeg_t *pj = pjpeg_create_from_buffer(buf, buflen, flags, error);

    free(buf);
    return pj;
}